

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model_set.c
# Opt level: O0

ngram_model_t *
ngram_model_set_add(ngram_model_t *base,ngram_model_t *model,char *name,float32 weight,
                   int reuse_widmap)

{
  int iVar1;
  int32 iVar2;
  uint32 *puVar3;
  void *pvVar4;
  char *pcVar5;
  logmath_t *plVar6;
  float fVar7;
  int32 **new_widmap;
  int32 i;
  int32 scale;
  float32 fprob;
  ngram_model_set_t *set;
  int reuse_widmap_local;
  float32 weight_local;
  char *name_local;
  ngram_model_t *model_local;
  ngram_model_t *base_local;
  
  base[1].refcount = base[1].refcount + 1;
  puVar3 = (uint32 *)
           __ckd_realloc__(base[1].n_counts,(long)base[1].refcount << 3,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_set.c"
                           ,0x217);
  base[1].n_counts = puVar3;
  *(ngram_model_t **)(base[1].n_counts + (long)(base[1].refcount + -1) * 2) = model;
  pvVar4 = __ckd_realloc__(*(void **)&base[1].n_1g_alloc,(long)base[1].refcount << 3,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_set.c"
                           ,0x21a);
  *(void **)&base[1].n_1g_alloc = pvVar4;
  pcVar5 = __ckd_salloc__(name,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_set.c"
                          ,0x21b);
  *(char **)(*(long *)&base[1].n_1g_alloc + (long)(base[1].refcount + -1) * 8) = pcVar5;
  if (base->n < model->n) {
    base->n = model->n;
    pvVar4 = __ckd_realloc__(*(void **)&base[1].lw,(long)(int)(model->n - 1) << 2,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_set.c"
                             ,0x220);
    *(void **)&base[1].lw = pvVar4;
  }
  fVar7 = ((float)weight * 1.0) / (float)base[1].refcount;
  pvVar4 = __ckd_realloc__(*(void **)&base[1].n,(long)base[1].refcount << 2,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_set.c"
                           ,0x226);
  *(void **)&base[1].n = pvVar4;
  iVar1 = logmath_log(base->lmath,(float64)(double)fVar7);
  *(int *)(*(long *)&base[1].n + (long)(base[1].refcount + -1) * 4) = iVar1;
  iVar1 = logmath_log(base->lmath,(float64)(1.0 - (double)fVar7));
  for (new_widmap._4_4_ = 0; new_widmap._4_4_ < base[1].refcount + -1;
      new_widmap._4_4_ = new_widmap._4_4_ + 1) {
    *(int *)(*(long *)&base[1].n + (long)new_widmap._4_4_ * 4) =
         iVar1 + *(int *)(*(long *)&base[1].n + (long)new_widmap._4_4_ * 4);
  }
  if (reuse_widmap == 0) {
    build_widmap(base,base->lmath,(uint)base->n);
  }
  else {
    plVar6 = (logmath_t *)
             __ckd_calloc_2d__((long)base->n_words,(long)base[1].refcount,4,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_set.c"
                               ,0x235);
    for (new_widmap._4_4_ = 0; new_widmap._4_4_ < base->n_words;
        new_widmap._4_4_ = new_widmap._4_4_ + 1) {
      memcpy((&(plVar6->t).table)[new_widmap._4_4_],(&((base[1].lmath)->t).table)[new_widmap._4_4_],
             (long)(base[1].refcount + -1) << 2);
      iVar2 = ngram_wid(model,base->word_str[new_widmap._4_4_]);
      *(int32 *)((long)(&(plVar6->t).table)[new_widmap._4_4_] + (long)(base[1].refcount + -1) * 4) =
           iVar2;
    }
    ckd_free_2d(base[1].lmath);
    base[1].lmath = plVar6;
  }
  return model;
}

Assistant:

ngram_model_t *
ngram_model_set_add(ngram_model_t * base,
                    ngram_model_t * model,
                    const char *name, float32 weight, int reuse_widmap)
{
    ngram_model_set_t *set = (ngram_model_set_t *) base;
    float32 fprob;
    int32 scale, i;

    /* Add it to the array of lms. */
    ++set->n_models;
    set->lms = ckd_realloc(set->lms, set->n_models * sizeof(*set->lms));
    set->lms[set->n_models - 1] = model;
    set->names =
        ckd_realloc(set->names, set->n_models * sizeof(*set->names));
    set->names[set->n_models - 1] = ckd_salloc(name);
    /* Expand the history mapping table if necessary. */
    if (model->n > base->n) {
        base->n = model->n;
        set->maphist = ckd_realloc(set->maphist,
                                   (model->n - 1) * sizeof(*set->maphist));
    }

    /* Renormalize the interpolation weights. */
    fprob = weight * 1.0f / set->n_models;
    set->lweights = ckd_realloc(set->lweights,
                                set->n_models * sizeof(*set->lweights));
    set->lweights[set->n_models - 1] = logmath_log(base->lmath, fprob);
    /* Now normalize everything else to fit it in.  This is
     * accomplished by simply scaling all the other probabilities
     * by (1-fprob). */
    scale = logmath_log(base->lmath, 1.0 - fprob);
    for (i = 0; i < set->n_models - 1; ++i)
        set->lweights[i] += scale;

    /* Reuse the old word ID mapping if requested. */
    if (reuse_widmap) {
        int32 **new_widmap;

        /* Tack another column onto the widmap array. */
        new_widmap = (int32 **) ckd_calloc_2d(base->n_words, set->n_models,
                                              sizeof(**new_widmap));
        for (i = 0; i < base->n_words; ++i) {
            /* Copy all the existing mappings. */
            memcpy(new_widmap[i], set->widmap[i],
                   (set->n_models - 1) * sizeof(**new_widmap));
            /* Create the new mapping. */
            new_widmap[i][set->n_models - 1] =
                ngram_wid(model, base->word_str[i]);
        }
        ckd_free_2d((void **) set->widmap);
        set->widmap = new_widmap;
    }
    else {
        build_widmap(base, base->lmath, base->n);
    }
    return model;
}